

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<fmt::v5::basic_string_view<char>,char[3]>
          (internal *this,char *expected_expression,char *actual_expression,
          basic_string_view<char> *expected,char (*actual) [3])

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  size_t __n;
  basic_string_view<char> *extraout_RDX;
  basic_string_view<char> *value;
  void **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  bool bVar5;
  AssertionResult AVar6;
  string local_78;
  string local_58;
  char (*local_38) [3];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  uVar1 = expected->size_;
  sVar3 = strlen(*actual);
  __n = sVar3;
  if (uVar1 < sVar3) {
    __n = uVar1;
  }
  if (__n == 0) {
    bVar5 = true;
    value = (basic_string_view<char> *)0x0;
  }
  else {
    iVar2 = bcmp(expected->data_,actual,__n);
    bVar5 = iVar2 == 0;
    value = extraout_RDX;
  }
  if ((uVar1 == sVar3) && (bVar5)) {
    AVar6 = AssertionSuccess();
    sVar4 = AVar6.message_.ptr_;
  }
  else {
    PrintToString<fmt::v5::basic_string_view<char>>(&local_58,(testing *)expected,value);
    local_38 = actual;
    PrintToString<void_const*>(&local_78,(testing *)&local_38,value_00);
    AVar6 = EqFailure(this,expected_expression,actual_expression,&local_58,&local_78,false);
    sVar4 = AVar6.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
      sVar4.ptr_ = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      sVar4.ptr_ = extraout_RDX_01;
    }
  }
  AVar6.message_.ptr_ = sVar4.ptr_;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}